

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall RefTable::Finalize(RefTable *this)

{
  ulong local_20;
  SQUnsignedInteger n;
  RefNode *nodes;
  RefTable *this_local;
  
  n = (SQUnsignedInteger)this->_nodes;
  for (local_20 = 0; local_20 < this->_numofslots; local_20 = local_20 + 1) {
    ::SQObjectPtr::Null((SQObjectPtr *)n);
    n = n + 0x20;
  }
  return;
}

Assistant:

void RefTable::Finalize()
{
    RefNode *nodes = _nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        nodes->obj.Null();
        nodes++;
    }
}